

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

double baryonyx::itm::compute_delta<double,baryonyx::itm::default_cost_type<double>>
                 (context *ctx,default_cost_type<double> *c,double theta,int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double local_38;
  double ret;
  double mini;
  double dStack_20;
  int n_local;
  double theta_local;
  default_cost_type<double> *c_local;
  context *ctx_local;
  
  mini._4_4_ = n;
  dStack_20 = theta;
  theta_local = (double)c;
  c_local = (default_cost_type<double> *)ctx;
  info<>(ctx,"  - delta not defined, compute it:\n");
  auVar1._0_8_ = default_cost_type<double>::min((default_cost_type<double> *)theta_local,mini._4_4_)
  ;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = auVar1._0_8_;
  auVar1._8_8_ = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = -dStack_20;
  auVar2 = vfmadd213sd_fma(auVar1,auVar2,auVar3);
  local_38 = auVar2._0_8_;
  ret = auVar1._0_8_;
  info<double,double,double>
            ((context *)c_local,"    - delta={} (min normalized cost:{} / theta: {})\n",&local_38,
             &ret,&stack0xffffffffffffffe0);
  return local_38;
}

Assistant:

inline Float
compute_delta(const context& ctx, const Cost& c, Float theta, int n)
{
    info(ctx, "  - delta not defined, compute it:\n");

    const auto mini = c.min(n);
    const auto ret = mini - theta * mini;

    info(ctx,
         "    - delta={} (min normalized cost:{} / theta: {})\n",
         ret,
         mini,
         theta);

    return ret;
}